

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O0

bool __thiscall imrt::ApertureILS::perturbate(ApertureILS *this,int no_improvement,int iteration)

{
  int iteration_local;
  int no_improvement_local;
  ApertureILS *this_local;
  bool local_1;
  
  if ((this->do_perturbate & 1U) == 0) {
    local_1 = false;
  }
  else if (no_improvement == 100) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ApertureILS::perturbate(int no_improvement, int iteration) {
  if (!do_perturbate) return(false);
  //if (no_improvement >= ((double) iteration)*0.3) {  
  //  return(true);
  //}
  if (no_improvement==100) return(true);
    return(false);
}